

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O1

bool iDynTree::calculateDH
               (Axis *zAxis_i_minus_1,Axis *xAxis_i_minus_1,Position *origin_i_minus_1,Axis *zAxis_i
               ,Direction *xAxis_n_direction_hint,Position *origin_i,Axis *xAxis_i,Axis *yAxis_i,
               DHLink *dhParams,double tol,int verbose)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  PointerType ptr;
  Position *pPVar7;
  ulong uVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  pointer pDVar12;
  PointerType ptr_8;
  long lVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  Position x_i_z_i_minus_1_intersection_A;
  Position x_i_z_i_minus_1_intersection_B;
  Position point_on_zAxis_i_minus_1_closest_to_zAxis_i;
  vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> local_298;
  Position *local_278;
  undefined8 uStack_270;
  Direction local_268;
  Direction *local_248;
  pointer pDStack_240;
  pointer local_230;
  Position *local_228;
  double dStack_220;
  Axis *local_218;
  double dStack_210;
  Axis *local_200;
  double local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  double local_1d8;
  Position local_1c8 [24];
  Axis local_1b0;
  Axis local_180;
  Axis local_150;
  Axis local_120;
  Axis local_f0;
  Axis local_c0;
  Axis local_90;
  Axis local_60;
  
  local_278 = origin_i_minus_1;
  local_248 = xAxis_n_direction_hint;
  local_218 = xAxis_i_minus_1;
  iDynTree::Position::Position(local_1c8);
  iDynTree::Axis::Axis(&local_60,zAxis_i_minus_1);
  iDynTree::Axis::Axis(&local_90,zAxis_i);
  bVar4 = closestPoints(&local_60,&local_90,local_1c8,origin_i,tol);
  if (!bVar4) {
    pPVar7 = (Position *)iDynTree::Axis::getOrigin();
    iDynTree::Position::operator=(origin_i,pPVar7);
  }
  iDynTree::Axis::setOrigin((Position *)xAxis_i);
  iDynTree::Axis::setOrigin((Position *)yAxis_i);
  iDynTree::Axis::Axis(&local_c0,zAxis_i_minus_1);
  iDynTree::Axis::Axis(&local_f0,zAxis_i);
  bVar4 = checkIfAxesAreIncident(&local_c0,&local_f0,1e-06);
  iDynTree::Axis::Axis(&local_120,zAxis_i_minus_1);
  iDynTree::Axis::Axis(&local_150,zAxis_i);
  bVar5 = checkIfAxesAreCoincident(&local_120,&local_150,1e-06);
  local_228 = origin_i;
  if (bVar4) {
    if (bVar5) {
      local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
      _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
      local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::push_back
                (&local_298,local_248);
      iDynTree::Direction::Direction(&local_268,1.0,0.0,0.0);
      std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::
      emplace_back<iDynTree::Direction>(&local_298,&local_268);
      iDynTree::Direction::Direction(&local_268,0.0,1.0,0.0);
      std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::
      emplace_back<iDynTree::Direction>(&local_298,&local_268);
      iDynTree::Direction::Direction(&local_268,0.0,0.0,1.0);
      std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::
      emplace_back<iDynTree::Direction>(&local_298,&local_268);
      if (local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar13 = 0;
        uVar11 = 0;
        pDVar12 = local_298.
                  super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          iDynTree::Axis::getDirection();
          cVar6 = iDynTree::Direction::isParallel
                            ((Direction *)((long)(pDVar12->super_Vector3).m_data + lVar13),tol);
          if (cVar6 == '\0') {
            iDynTree::Direction::operator=
                      (&local_268,
                       (Direction *)
                       ((long)((local_298.
                                super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_Vector3).m_data +
                       lVar13));
            break;
          }
          uVar11 = uVar11 + 1;
          uVar8 = ((long)local_298.
                         super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_298.
                         super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          lVar13 = lVar13 + 0x18;
          pDVar12 = local_298.
                    super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar11 <= uVar8 && uVar8 - uVar11 != 0);
      }
      pdVar9 = (double *)iDynTree::Axis::getDirection();
      dVar22 = pdVar9[2] * local_268.super_Vector3.m_data[2] +
               pdVar9[1] * local_268.super_Vector3.m_data[1] +
               *pdVar9 * local_268.super_Vector3.m_data[0];
      local_1e8._0_8_ = local_268.super_Vector3.m_data[0] - dVar22 * *pdVar9;
      local_1e8._8_8_ = local_268.super_Vector3.m_data[1] - dVar22 * pdVar9[1];
      local_1d8 = local_268.super_Vector3.m_data[2] - pdVar9[2] * dVar22;
      auVar16._0_8_ =
           local_1d8 * local_1d8 +
           (double)local_1e8._8_8_ * (double)local_1e8._8_8_ +
           (double)local_1e8._0_8_ * (double)local_1e8._0_8_;
      if (0.0 < auVar16._0_8_) {
        auVar16._8_8_ = 0;
        auVar17 = sqrtpd(auVar16,auVar16);
        auVar18._0_8_ = auVar17._0_8_;
        local_1d8 = local_1d8 / auVar18._0_8_;
        auVar18._8_8_ = auVar18._0_8_;
        local_1e8 = divpd(local_1e8,auVar18);
      }
      iDynTree::Axis::setDirection(&xAxis_i->direction);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "ExtractDHChainFromModel : DH representation is not unique, made an arbitrary choice for x_i direction\n"
                 ,0x66);
      if (local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_298.
                        super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_298.
                              super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_298.
                              super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      pdVar9 = (double *)iDynTree::Axis::getDirection();
      pdVar10 = (double *)iDynTree::Axis::getDirection();
      local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)(pdVar10[2] * pdVar9[1] - pdVar9[2] * pdVar10[1]);
      local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)(*pdVar10 * pdVar9[2] - *pdVar9 * pdVar10[2]);
      dVar22 = *pdVar9 * pdVar10[1] - *pdVar10 * pdVar9[1];
      auVar20._0_8_ =
           dVar22 * dVar22 +
           (double)local_298.
                   super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                   _M_impl.super__Vector_impl_data._M_finish *
           (double)local_298.
                   super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                   _M_impl.super__Vector_impl_data._M_finish +
           (double)local_298.
                   super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                   _M_impl.super__Vector_impl_data._M_start *
           (double)local_298.
                   super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      if (0.0 < auVar20._0_8_) {
        auVar20._8_8_ = 0;
        auVar17 = sqrtpd(auVar20,auVar20);
        auVar21._0_8_ = auVar17._0_8_;
        dVar22 = dVar22 / auVar21._0_8_;
        auVar21._8_8_ = auVar21._0_8_;
        local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
        _M_impl.super__Vector_impl_data._0_16_ =
             divpd((undefined1  [16])
                   local_298.
                   super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                   _M_impl.super__Vector_impl_data._0_16_,auVar21);
      }
      dVar15 = local_298.
               super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>._M_impl
               .super__Vector_impl_data._M_finish;
      dVar19 = (local_248->super_Vector3).m_data[2] * dVar22 +
               (local_248->super_Vector3).m_data[1] * dVar15 +
               (local_248->super_Vector3).m_data[0] *
               local_298.
               super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (dVar19 < 0.0) {
        local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)-local_298.
                       super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)-dVar15;
      }
      uVar11 = -(ulong)(dVar19 < 0.0);
      local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(~uVar11 & (ulong)dVar22 | (ulong)-dVar22 & uVar11);
      iDynTree::Axis::setDirection(&xAxis_i->direction);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "ExtractDHChainFromModel : DH representation is not unique, made an arbitrary choice for x_i sign\n"
                 ,0x61);
    }
  }
  else {
    iDynTree::Position::operator-((Position *)&local_298,origin_i);
    local_248 = local_298.
                super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                _M_impl.super__Vector_impl_data._M_start;
    pDStack_240 = local_298.
                  super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_230 = local_298.
                super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    pdVar9 = (double *)iDynTree::Axis::getDirection();
    local_1f8 = pdVar9[2] * (double)local_230 +
                pdVar9[1] * (double)pDStack_240 + *pdVar9 * (double)local_248;
    uStack_1f0 = 0;
    pdVar9 = (double *)iDynTree::Axis::getDirection();
    local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)((double)local_248 - *pdVar9 * local_1f8);
    local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)((double)pDStack_240 - pdVar9[1] * local_1f8);
    local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)((double)local_230 - local_1f8 * pdVar9[2])
    ;
    auVar17._0_8_ =
         (double)local_298.
                 super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage *
         (double)local_298.
                 super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage +
         (double)local_298.
                 super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                 _M_impl.super__Vector_impl_data._M_finish *
         (double)local_298.
                 super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                 _M_impl.super__Vector_impl_data._M_finish +
         (double)local_298.
                 super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                 _M_impl.super__Vector_impl_data._M_start *
         (double)local_298.
                 super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    if (0.0 < auVar17._0_8_) {
      auVar17._8_8_ = 0;
      auVar17 = sqrtpd(auVar17,auVar17);
      auVar14._0_8_ = auVar17._0_8_;
      local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((double)local_298.
                             super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage / auVar14._0_8_);
      auVar14._8_8_ = auVar14._0_8_;
      local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
      _M_impl.super__Vector_impl_data._0_16_ =
           divpd((undefined1  [16])
                 local_298.
                 super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>.
                 _M_impl.super__Vector_impl_data._0_16_,auVar14);
    }
    iDynTree::Axis::setDirection(&xAxis_i->direction);
  }
  local_200 = zAxis_i;
  pdVar9 = (double *)iDynTree::Axis::getDirection();
  pdVar10 = (double *)iDynTree::Axis::getDirection();
  local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(*pdVar9 * pdVar10[1] - *pdVar10 * pdVar9[1])
  ;
  local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(*pdVar10 * pdVar9[2] - *pdVar9 * pdVar10[2]);
  local_298.super__Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(pdVar10[2] * pdVar9[1] - pdVar9[2] * pdVar10[1]);
  iDynTree::Axis::setDirection(&yAxis_i->direction);
  iDynTree::Position::Position((Position *)&local_268);
  iDynTree::Position::Position((Position *)local_1e8);
  iDynTree::Axis::Axis(&local_180,zAxis_i_minus_1);
  iDynTree::Axis::Axis(&local_1b0,xAxis_i);
  closestPoints(&local_180,&local_1b0,(Position *)&local_268,(Position *)local_1e8,tol);
  pdVar9 = (double *)iDynTree::Axis::getDirection();
  dhParams->A = -((local_1d8 - *(double *)(local_228 + 0x10)) * pdVar9[2] +
                 pdVar9[1] * ((double)local_1e8._8_8_ - *(double *)(local_228 + 8)) +
                 *pdVar9 * ((double)local_1e8._0_8_ - *(double *)local_228));
  pdVar9 = (double *)iDynTree::Axis::getDirection();
  dhParams->D = (local_268.super_Vector3.m_data[2] - *(double *)(local_278 + 0x10)) * pdVar9[2] +
                pdVar9[1] * (local_268.super_Vector3.m_data[1] - *(double *)(local_278 + 8)) +
                *pdVar9 * (local_268.super_Vector3.m_data[0] - *(double *)local_278);
  pdVar9 = (double *)iDynTree::Axis::getDirection();
  pdVar10 = (double *)iDynTree::Axis::getDirection();
  dVar19 = *pdVar9;
  dVar1 = pdVar9[1];
  dVar2 = *pdVar10;
  dVar3 = pdVar10[1];
  dVar22 = pdVar9[2];
  dVar15 = pdVar10[2];
  pdVar9 = (double *)iDynTree::Axis::getDirection();
  pdVar10 = (double *)iDynTree::Axis::getDirection();
  local_228 = (Position *)(pdVar10[2] * pdVar9[1] - pdVar9[2] * pdVar10[1]);
  dStack_220 = *pdVar10 * pdVar9[2] - *pdVar9 * pdVar10[2];
  local_278 = (Position *)(*pdVar9 * pdVar10[1] - *pdVar10 * pdVar9[1]);
  uStack_270 = 0;
  pdVar9 = (double *)iDynTree::Axis::getDirection();
  dVar22 = atan2((double)local_278 * pdVar9[2] +
                 pdVar9[1] * dStack_220 + *pdVar9 * (double)local_228,
                 dVar22 * dVar15 + dVar3 * dVar1 + dVar2 * dVar19);
  dhParams->Alpha = dVar22;
  pdVar9 = (double *)iDynTree::Axis::getDirection();
  pdVar10 = (double *)iDynTree::Axis::getDirection();
  dVar19 = *pdVar9;
  dVar1 = pdVar9[1];
  dVar2 = *pdVar10;
  dVar3 = pdVar10[1];
  dVar22 = pdVar9[2];
  dVar15 = pdVar10[2];
  pdVar9 = (double *)iDynTree::Axis::getDirection();
  pdVar10 = (double *)iDynTree::Axis::getDirection();
  local_218 = (Axis *)(pdVar10[2] * pdVar9[1] - pdVar9[2] * pdVar10[1]);
  dStack_210 = *pdVar10 * pdVar9[2] - *pdVar9 * pdVar10[2];
  local_278 = (Position *)(*pdVar9 * pdVar10[1] - *pdVar10 * pdVar9[1]);
  uStack_270 = 0;
  pdVar9 = (double *)iDynTree::Axis::getDirection();
  dVar22 = atan2((double)local_278 * pdVar9[2] +
                 pdVar9[1] * dStack_210 + *pdVar9 * (double)local_218,
                 dVar22 * dVar15 + dVar3 * dVar1 + dVar2 * dVar19);
  dhParams->Offset = dVar22;
  return true;
}

Assistant:

bool calculateDH(const iDynTree::Axis zAxis_i_minus_1,
                 const iDynTree::Axis xAxis_i_minus_1,
                 const iDynTree::Position origin_i_minus_1,
                 const iDynTree::Axis zAxis_i,
                 const iDynTree::Direction xAxis_n_direction_hint,
                       iDynTree::Position & origin_i,
                       iDynTree::Axis & xAxis_i,
                       iDynTree::Axis & yAxis_i,
                       DHLink & dhParams,
                       double tol = 1e-6,
                       int verbose = 0)
{
    // STEP 3 : Locate O_i (the origin of i-th frame)
    //          Locate the origin O_i where the common normal to z_i and z_{i-1} intersects
    //          z_i . If z_i intersects z_{i-1}, locate O_i at this intersection. If z_i and
    //          z_{i-1} are parallel, locate O_i to any convenenient location along z_i .
    bool zAxes_not_parallel;
    iDynTree::Position point_on_zAxis_i_minus_1_closest_to_zAxis_i;

    // Compute the closest point of the axis z_i-1 and z_i
    // During this computation we get as a byproduct if the two
    // axis are parallel. If the axis are not parallel, then the
    // origin of the frame i is given by the point on z_i closest
    // to z_i_minus_1
    zAxes_not_parallel = closestPoints(zAxis_i_minus_1,
                                 zAxis_i,
                                 point_on_zAxis_i_minus_1_closest_to_zAxis_i,
                                 origin_i,
                                 tol);

    if( !zAxes_not_parallel )
    {
        //if parallel, the origin is not specified and we resort to the original one of the chain
        origin_i = zAxis_i.getOrigin();
    }

    // At this point, we can already set the origin of the the axis of i-th frame

    // \todo check that origin_i actually lies on zAxis_i

    xAxis_i.setOrigin(origin_i);
    yAxis_i.setOrigin(origin_i);

    //
    // We check if z_i and z_i-1 are incident
    //
    bool zAxes_incident = checkIfAxesAreIncident(zAxis_i_minus_1,zAxis_i);

    bool zAxes_coincident = checkIfAxesAreCoincident(zAxis_i_minus_1,zAxis_i);

    //STEP 4 : Establish the direction of x axis of the i-th frame
    //         Establish x_i along the common normal between z_{i-1} and z_i throught O_i,
    //         or in the direction normal to the z_{i-1} - z_{i} plane if z_{i-1} and z_i intersect.

    // While the book distingush just two cases for STEP 4 , we need to actually distinguish three
    // different cases :
    // * z_{i-1} and z_{i} are not incident : in this case the direction of the common normal is always defined,
    //   and in particular we compute it as the difference between the two origins, projected on the spaces
    //   orthogonal to z_i.
    // * z_{i-1} and z_{i} are incident, but not coincident: then the two axis define a plane with a unique axis
    // * z_{i-1} and z_{i} are coincident (i.e. incident and parallel): in this case there are infinite normals,
    //   and so we choose x_i using the hint provided (tipically the x_i used in the previous representation).
    if( !zAxes_incident )
    {
        // not incident

        // If the axis are not incident, the x axis is the common normal of the two axis
        Eigen::Vector3d origin_diff = toEigen(origin_i-origin_i_minus_1);

        // To actually get the normal, we remove from the origin_diff the projection on z_i_minus_1
        Eigen::Vector3d x_i_candidate_eig = origin_diff-origin_diff.dot(toEigen(zAxis_i_minus_1.getDirection()))*toEigen(zAxis_i_minus_1.getDirection());

        x_i_candidate_eig.normalize();

        iDynTree::Direction x_i_candidate;
        iDynTree::toEigen(x_i_candidate) = x_i_candidate_eig;

        xAxis_i.setDirection(x_i_candidate);
    }
    else
    {
        if( !zAxes_coincident )
        {
            // incident but not coincident
            Eigen::Vector3d x_i_candidate_eig  = toEigen(zAxis_i_minus_1.getDirection()).cross(toEigen(zAxis_i.getDirection()));
            x_i_candidate_eig.normalize();

            // Check direction, use hint
            //The positive direction of the axis_x_n is arbitrary, however for dealing with limit case (link where
           // only alpha is different from zero)
           double dh_direction_axis_x_n_sign = x_i_candidate_eig.dot(toEigen(xAxis_n_direction_hint) );
           if (dh_direction_axis_x_n_sign < 0.0)
           {
               x_i_candidate_eig = -x_i_candidate_eig;
           }

           iDynTree::Direction x_i_candidate;
           iDynTree::toEigen(x_i_candidate) = x_i_candidate_eig;

           xAxis_i.setDirection(x_i_candidate);

           std::cerr << "ExtractDHChainFromModel : DH representation is not unique, made an arbitrary choice for x_i sign\n";
        }
        else
        {
            // coincident
            // if the two axis are coincident, the direction of dh_direction_axis_x_n is totally arbitrary
            // as long as it is perpendicular to zAxis. We will take then the hint provided by : direction_axis_x_n_hint
            // to get the dh_direction_axis_x_n, we will project direction_axis_x_n_hint onto the plane
            // perpendicular to axis_z_n_minus_1 == axis_z_n, and will normalize the resulting vector
            // if dh_direction_axis_x_n is parallel to the two axis, we just apply the same procedure to (1,0,0), (0,1,0)
            // and (0,0,1) (in the base frame) in this order. At least two of this three vectors will not be parallel with
            // the axis of the joint, and so they can be used as hints for the direction of
            std::vector<iDynTree::Direction> candidateDirectionHints;
            candidateDirectionHints.push_back(xAxis_n_direction_hint);
            candidateDirectionHints.push_back(iDynTree::Direction(1.0, 0.0, 0.0));
            candidateDirectionHints.push_back(iDynTree::Direction(0.0, 1.0, 0.0));
            candidateDirectionHints.push_back(iDynTree::Direction(0.0, 0.0, 1.0));

            iDynTree::Direction xDirectionHintNotParallelToZ;
            for(int k=0; k < candidateDirectionHints.size(); k++)
            {
                if (candidateDirectionHints[k].isParallel(zAxis_i.getDirection(), tol))
                {
                    continue;
                }
                else
                {
                    xDirectionHintNotParallelToZ = candidateDirectionHints[k];
                    break;
                }
            }

            Eigen::Vector3d direction_axis_z_i_eig = toEigen(zAxis_i.getDirection());
            Eigen::Vector3d x_i_candidate_eig = toEigen(xDirectionHintNotParallelToZ) -
                                                toEigen(xDirectionHintNotParallelToZ).dot(direction_axis_z_i_eig) *
                                                direction_axis_z_i_eig;

            x_i_candidate_eig.normalize();

            iDynTree::Direction x_i_candidate;
            iDynTree::toEigen(x_i_candidate) = x_i_candidate_eig;

            xAxis_i.setDirection(x_i_candidate);

            std::cerr << "ExtractDHChainFromModel : DH representation is not unique, made an arbitrary choice for x_i direction\n";
        }
    }

    // STEP 4 ADDENDUM : get y_i

    // Once the direction of axis z_n and x_n has been determined,
    //  the direction of axis y_n is simply given by a cross product to
    //  ensure a right handed coordinates system
    iDynTree::Direction y_i_candidate;
    toEigen(y_i_candidate) = toEigen(zAxis_i.getDirection()).cross(toEigen(xAxis_i.getDirection()));

    yAxis_i.setDirection(y_i_candidate);


    ////////////////////////////////////////////////////////////////////
    // STEP 5: Computation of DH parameters
    ////////////////////////////////////////////////////////////////////

    //calculation of a_i
    //distance along x_i from O_i to the intersection of the x_i and z_{i-1} axes
    iDynTree::Position x_i_z_i_minus_1_intersection_A, x_i_z_i_minus_1_intersection_B;

    closestPoints(zAxis_i_minus_1,
                  xAxis_i,
                  x_i_z_i_minus_1_intersection_A,
                  x_i_z_i_minus_1_intersection_B,
                  tol);

    //x_i and z_{i-1} should intersecate
    assert(checkIfAxesAreIncident(xAxis_i,zAxis_i_minus_1));

    dhParams.A = -(toEigen(x_i_z_i_minus_1_intersection_B)-toEigen(origin_i)).dot(toEigen(xAxis_i.getDirection()));

    //calculation of d_i
    //distance along z_{i-1} from O_{i-1} to the intersection of the x_i and z_{i-1} axes
    dhParams.D = (toEigen(x_i_z_i_minus_1_intersection_A)-toEigen(origin_i_minus_1)).dot(toEigen(zAxis_i_minus_1.getDirection()));

    //calculation of alpha_i
    //angle between z_{i-1} and z_i measured about x_i
    double cos_alpha_i = toEigen(zAxis_i_minus_1.getDirection()).dot(toEigen(zAxis_i.getDirection()));
    //assert(((direction_axis_z_n_minus_1*direction_axis_z_n)*dh_direction_axis_x_n).Norm() < tol);
    double sin_alpha_i = (toEigen(zAxis_i_minus_1.getDirection()).cross(toEigen(zAxis_i.getDirection()))).dot(toEigen(xAxis_i.getDirection()));
    //assert( fabs(cos_alpha_i*cos_alpha_i + sin_alpha_i*sin_alpha_i - 1) < tol);

    dhParams.Alpha = atan2(sin_alpha_i,cos_alpha_i);

    //calculation of theta_i
    //angle between x_{i-1} and x_i measure about z_{i-1}
    double cos_theta_i = toEigen(xAxis_i_minus_1.getDirection()).dot(toEigen(xAxis_i.getDirection()));
    double sin_theta_i = (toEigen(xAxis_i_minus_1.getDirection()).cross(toEigen(xAxis_i.getDirection()))).dot(toEigen(zAxis_i_minus_1.getDirection()));
    dhParams.Offset = atan2(sin_theta_i,cos_theta_i);

    return true;
}